

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

char GetBestLacingType(matroska_block *Element,int ForProfile)

{
  uint *puVar1;
  ebml_master *peVar2;
  byte bVar3;
  int iVar4;
  MatroskaTrackEncodingCompAlgo CompAlgo;
  ulong uVar5;
  ebml_context *peVar6;
  ebml_master *peVar7;
  ebml_integer *peVar8;
  int64_t iVar9;
  ulong uVar10;
  filepos_t fVar11;
  ulong uVar12;
  size_t sVar13;
  char cVar14;
  MatroskaContentEncodingScope CompScope;
  uint uVar15;
  int iVar16;
  uint uVar17;
  
  uVar5 = (Element->SizeList)._Used;
  if (uVar5 < 8) {
LAB_0010b9ba:
    cVar14 = '\0';
  }
  else {
    puVar1 = (uint *)(Element->SizeList)._Begin;
    uVar15 = *puVar1;
    uVar10 = (ulong)uVar15;
    uVar5 = uVar5 >> 2;
    uVar12 = 1;
    do {
      if (puVar1[uVar12] != uVar15) {
        if (uVar5 == uVar12) {
          return '\x02';
        }
        peVar7 = Element->WriteTrack;
        if (peVar7 == (ebml_master *)0x0) {
          __assert_fail("Element->WriteTrack!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x662,"char GetBestLacingType(const matroska_block *, int)");
        }
        peVar6 = MATROSKA_getContextContentEncodings();
        iVar16 = 0;
        peVar7 = (ebml_master *)EBML_MasterFindFirstElt(peVar7,peVar6,0,0,0);
        CompScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
        CompAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
        if (peVar7 == (ebml_master *)0x0) {
          peVar8 = (ebml_integer *)0x0;
        }
        else {
          peVar6 = MATROSKA_getContextContentEncoding();
          peVar7 = (ebml_master *)EBML_MasterFindFirstElt(peVar7,peVar6,0,0,0);
          peVar8 = (ebml_integer *)0x0;
          CompAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
          if ((peVar7->Base).Base.Children != (nodetree *)0x0) {
            peVar2 = (ebml_master *)(peVar7->Base).Base.Next;
            if (peVar7 == peVar2) {
              __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                            ,0x669,"char GetBestLacingType(const matroska_block *, int)");
            }
            if (peVar2 != (ebml_master *)0x0) goto LAB_0010b9ba;
            peVar6 = MATROSKA_getContextContentEncodingScope();
            peVar8 = (ebml_integer *)EBML_MasterFindFirstElt(peVar7,peVar6,0,0,0);
            if (peVar8 == (ebml_integer *)0x0) {
              CompScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
            }
            else {
              iVar9 = EBML_IntegerValue(peVar8);
              CompScope = (MatroskaContentEncodingScope)iVar9;
            }
            peVar6 = MATROSKA_getContextContentCompression();
            peVar7 = (ebml_master *)EBML_MasterFindFirstElt(peVar7,peVar6,0,0,0);
            if (peVar7 == (ebml_master *)0x0) {
              return '\0';
            }
            peVar6 = MATROSKA_getContextContentCompAlgo();
            peVar8 = (ebml_integer *)EBML_MasterFindFirstElt(peVar7,peVar6,1,1,ForProfile);
            if (peVar8 == (ebml_integer *)0x0) goto LAB_0010b9ba;
            iVar9 = EBML_IntegerValue(peVar8);
            CompAlgo = (MatroskaTrackEncodingCompAlgo)iVar9;
            if ((CompAlgo != MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP) &&
               (CompAlgo != MATROSKA_TRACK_ENCODING_COMP_ZLIB)) goto LAB_0010b9ba;
            iVar9 = EBML_IntegerValue(peVar8);
            if (iVar9 == 3) {
              peVar6 = MATROSKA_getContextContentCompSettings();
              peVar8 = (ebml_integer *)EBML_MasterFindFirstElt(peVar7,peVar6,0,0,0);
            }
          }
        }
        if (((Element->SizeList)._Used & 0xfffffffffffffffc) != 4) {
          sVar13 = 0;
          iVar16 = 0;
          do {
            uVar10 = GetBlockFrameSize(Element,sVar13,&peVar8->Base,CompAlgo,CompScope);
            uVar15 = (uint)uVar10;
            if (0xfe < (int)uVar15) {
              iVar4 = uVar15 - 0x1fd;
              if (uVar15 < 0x1fd) {
                iVar4 = 0;
              }
              uVar17 = (iVar4 + 0xfeU) / 0xff;
              iVar16 = iVar16 + uVar17 + 1;
              uVar10 = (ulong)((uVar15 + (iVar4 + 0xfeU) / 0xff + uVar17 * -0x100) - 0xff);
            }
            iVar16 = iVar16 + 1;
            sVar13 = sVar13 + 1;
          } while (sVar13 < ((Element->SizeList)._Used >> 2) - 1);
        }
        fVar11 = GetBlockFrameSize(Element,0,&peVar8->Base,CompAlgo,CompScope);
        sVar13 = 1;
        bVar3 = EBML_CodedSizeLength(fVar11,'\0',1);
        uVar15 = (uint)bVar3;
        if (((Element->SizeList)._Used >> 2) - 3 < 0xfffffffffffffffe) {
          do {
            fVar11 = GetBlockFrameSize(Element,sVar13,&peVar8->Base,CompAlgo,CompScope);
            uVar17 = (int)fVar11 - (int)uVar10;
            bVar3 = EBML_CodedSizeLengthSigned((long)(int)uVar17,'\0');
            uVar15 = uVar15 + bVar3;
            sVar13 = sVar13 + 1;
            uVar10 = (ulong)uVar17;
          } while (sVar13 < ((Element->SizeList)._Used >> 2) - 1);
        }
        return ((int)uVar15 <= iVar16) * '\x02' + '\x01';
      }
      uVar12 = uVar12 + 1;
    } while (uVar5 != uVar12);
    cVar14 = '\x02';
  }
  return cVar14;
}

Assistant:

static char GetBestLacingType(const matroska_block *Element, int ForProfile)
{
    int XiphLacingSize, EbmlLacingSize;
    size_t i;
    int32_t DataSize;
    ebml_element *Elt, *Elt2, *Header = NULL;
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;

    if (ARRAYCOUNT(Element->SizeList,int32_t) <= 1)
        return LACING_NONE;

    DataSize = ARRAYBEGIN(Element->SizeList,int32_t)[0];
    for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t);++i)
    {
        if (ARRAYBEGIN(Element->SizeList,int32_t)[i]!=DataSize)
            break;
    }
    if (i==ARRAYCOUNT(Element->SizeList,int32_t))
        return LACING_FIXED;

    // find out if compressed headers are used
    assert(Element->WriteTrack!=NULL);
    Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return 0; // TODO support cascaded compression/encryption

            Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
            if (Elt2)
                CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return 0; // TODO: support encryption

            Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
            if (Header)
                CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
            bool_t CanCompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanCompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanCompress = 1;
#endif
            if (!CanCompress)
                return 0;

            if (EBML_IntegerValue((ebml_integer*)Header)==MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
        }
    }

    XiphLacingSize = 0;
    for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
    {
        DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
        while (DataSize >= 0xFF)
        {
            XiphLacingSize++;
            DataSize -= 0xFF;
        }
        XiphLacingSize++;
    }

    EbmlLacingSize = EBML_CodedSizeLength(GetBlockFrameSize(Element, 0, Header, CompressionAlgo, CompressionScope),0,1);
    for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
    {
        DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope) - DataSize;
        EbmlLacingSize += EBML_CodedSizeLengthSigned(DataSize,0);
    }

    if (XiphLacingSize < EbmlLacingSize)
        return LACING_XIPH;
    else
        return LACING_EBML;
}